

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

void __thiscall QMakeEvaluator::evaluateCommand(QMakeEvaluator *this,QString *cmds,QString *where)

{
  long lVar1;
  ProFile *pro;
  char16_t *tokPtr;
  value_type vVar2;
  QStringView contents;
  
  lVar1 = (cmds->d).size;
  if (lVar1 != 0) {
    contents.m_data = (cmds->d).ptr;
    contents.m_size = lVar1;
    pro = QMakeParser::parsedProBlock(this->m_parser,contents,0,where,-1,FullGrammar);
    if (pro->m_ok == true) {
      QList<QMakeEvaluator::Location>::emplaceBack<QMakeEvaluator::Location_const&>
                (&(this->m_locationStack).super_QList<QMakeEvaluator::Location>,&this->m_current);
      tokPtr = (pro->m_proitems).d.ptr;
      if (tokPtr == (char16_t *)0x0) {
        tokPtr = (char16_t *)&QString::_empty;
      }
      visitProBlock(this,pro,(ushort *)tokPtr);
      vVar2 = QList<QMakeEvaluator::Location>::takeLast
                        (&(this->m_locationStack).super_QList<QMakeEvaluator::Location>);
      (this->m_current).pro = vVar2.pro;
      (this->m_current).line = vVar2.line;
    }
    ProFile::deref(pro);
    return;
  }
  return;
}

Assistant:

void QMakeEvaluator::evaluateCommand(const QString &cmds, const QString &where)
{
    if (!cmds.isEmpty()) {
        ProFile *pro = m_parser->parsedProBlock(QStringView(cmds), 0, where, -1);
        if (pro->isOk()) {
            m_locationStack.push(m_current);
            visitProBlock(pro, pro->tokPtr());
            m_current = m_locationStack.pop();
        }
        pro->deref();
    }
}